

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

u64 filterHash(Mem *aMem,Op *pOp)

{
  ushort uVar1;
  long lVar2;
  Mem *pMem;
  long lVar3;
  u64 uVar4;
  long lVar5;
  
  if ((long)(pOp->p4).i < 1) {
    uVar4 = 0;
  }
  else {
    lVar3 = (long)pOp->p3;
    lVar5 = (pOp->p4).i + lVar3;
    pMem = aMem + lVar3;
    uVar4 = 0;
    do {
      uVar1 = pMem->flags;
      if ((uVar1 & 0x24) == 0) {
        if ((uVar1 & 8) == 0) {
          if (((uVar1 & 0x12) == 0) || (uVar4 = uVar4 + (long)pMem->n, (uVar1 >> 10 & 1) == 0))
          goto LAB_00163ee3;
          lVar2 = (long)(pMem->u).nZero;
        }
        else {
          lVar2 = sqlite3VdbeIntValue(pMem);
        }
        uVar4 = uVar4 + lVar2;
      }
      else {
        uVar4 = uVar4 + (long)(pMem->u).zPType;
      }
LAB_00163ee3:
      lVar3 = lVar3 + 1;
      pMem = pMem + 1;
    } while (lVar3 < lVar5);
  }
  return uVar4;
}

Assistant:

static u64 filterHash(const Mem *aMem, const Op *pOp){
  int i, mx;
  u64 h = 0;

  assert( pOp->p4type==P4_INT32 );
  for(i=pOp->p3, mx=i+pOp->p4.i; i<mx; i++){
    const Mem *p = &aMem[i];
    if( p->flags & (MEM_Int|MEM_IntReal) ){
      h += p->u.i;
    }else if( p->flags & MEM_Real ){
      h += sqlite3VdbeIntValue(p);
    }else if( p->flags & (MEM_Str|MEM_Blob) ){
      h += p->n;
      if( p->flags & MEM_Zero ) h += p->u.nZero;
    }
  }
  return h;
}